

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O3

void ggml_barrier(ggml_threadpool *tp)

{
  atomic_int *paVar1;
  int iVar2;
  
  if (tp->n_threads_cur != 1) {
    LOCK();
    paVar1 = &tp->n_barrier;
    iVar2 = *paVar1;
    *paVar1 = *paVar1 + 1;
    UNLOCK();
    if (iVar2 == tp->n_threads_cur + -1) {
      tp->n_barrier = 0;
      LOCK();
      tp->n_barrier_passed = tp->n_barrier_passed + 1;
      UNLOCK();
      return;
    }
    do {
    } while (tp->n_barrier_passed == tp->n_barrier_passed);
  }
  return;
}

Assistant:

void ggml_barrier(struct ggml_threadpool * tp) {
    int n_threads = atomic_load_explicit(&tp->n_threads_cur, memory_order_relaxed);
    if (n_threads == 1) {
        return;
    }

#ifdef GGML_USE_OPENMP
    #pragma omp barrier
#else
    int n_passed = atomic_load_explicit(&tp->n_barrier_passed, memory_order_relaxed);

    // enter barrier (full seq-cst fence)
    int n_barrier = atomic_fetch_add_explicit(&tp->n_barrier, 1, memory_order_seq_cst);

    if (n_barrier == (n_threads - 1)) {
        // last thread
        atomic_store_explicit(&tp->n_barrier, 0, memory_order_relaxed);

        // exit barrier (fill seq-cst fence)
        atomic_fetch_add_explicit(&tp->n_barrier_passed, 1, memory_order_seq_cst);
        return;
    }

    // wait for other threads
    while (atomic_load_explicit(&tp->n_barrier_passed, memory_order_relaxed) == n_passed) {
        ggml_thread_cpu_relax();
    }

    // exit barrier (full seq-cst fence)
    // TSAN doesn't support standalone fence yet, we use a dummy read-modify-write instead
    #ifdef GGML_TSAN_ENABLED
    atomic_fetch_add_explicit(&tp->n_barrier_passed, 0, memory_order_seq_cst);
    #else
    atomic_thread_fence(memory_order_seq_cst);
    #endif
#endif
}